

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::RepeatedImmutableEnumFieldLiteGenerator::GenerateMembers
          (RepeatedImmutableEnumFieldLiteGenerator *this,Printer *printer)

{
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *vars;
  FieldDescriptor *pFVar1;
  Context *pCVar2;
  pointer pcVar3;
  bool bVar4;
  MessageLite *pMVar5;
  EnumDescriptor *pEVar6;
  string_view begin_varname;
  string_view begin_varname_00;
  string_view begin_varname_01;
  string_view begin_varname_02;
  string_view begin_varname_03;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view text_05;
  string_view text_06;
  string_view text_07;
  string_view text_08;
  string_view text_09;
  string_view text_10;
  string_view text_11;
  string_view text_12;
  string_view text_13;
  string_view end_varname;
  string_view end_varname_00;
  string_view end_varname_01;
  string_view end_varname_02;
  string_view end_varname_03;
  undefined1 local_3f0 [8];
  _Alloc_hider local_3e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d8;
  _Alloc_hider local_3c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b8;
  undefined2 local_3a8;
  undefined1 local_3a0 [8];
  _Alloc_hider local_398;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_388;
  _Alloc_hider local_378;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_368;
  undefined2 local_358;
  undefined1 local_350 [8];
  _Alloc_hider local_348;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_338;
  _Alloc_hider local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  undefined2 local_308;
  undefined1 local_300 [8];
  _Alloc_hider local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  _Alloc_hider local_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  undefined2 local_2b8;
  undefined1 local_2b0 [8];
  _Alloc_hider local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  _Alloc_hider local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  undefined2 local_268;
  undefined1 local_260 [8];
  _Alloc_hider local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  _Alloc_hider local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  undefined2 local_218;
  undefined1 local_210 [8];
  _Alloc_hider local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  _Alloc_hider local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  undefined2 local_1c8;
  undefined1 local_1c0 [8];
  _Alloc_hider local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  _Alloc_hider local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  undefined2 local_178;
  undefined1 local_170 [8];
  _Alloc_hider local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  _Alloc_hider local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  undefined2 local_128;
  undefined1 local_120 [8];
  _Alloc_hider local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  _Alloc_hider local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  undefined2 local_d8;
  undefined1 local_d0 [8];
  _Alloc_hider local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  _Alloc_hider local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  undefined2 local_88;
  undefined1 local_80 [8];
  _Alloc_hider local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Alloc_hider local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  undefined2 local_38;
  
  vars = &this->variables_;
  text._M_str = 
  "private com.google.protobuf.Internal.IntList $name$_;\nprivate static final com.google.protobuf.Internal.IntListAdapter.IntConverter<\n    $type$> $name$_converter_ =\n        new com.google.protobuf.Internal.IntListAdapter.IntConverter<\n            $type$>() {\n          @java.lang.Override\n          public $type$ convert(int from) {\n            $type$ result = $type$.forNumber(from);\n            return result == null ? $unknown$ : result;\n          }\n        };\n"
  ;
  text._M_len = 0x1d0;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text);
  PrintExtraFieldInfo(vars,printer);
  pFVar1 = this->descriptor_;
  pCVar2 = this->context_;
  local_80[4] = (pCVar2->options_).opensource_runtime;
  local_80[5] = (pCVar2->options_).annotate_code;
  local_80[0] = (pCVar2->options_).generate_immutable_code;
  local_80[1] = (pCVar2->options_).generate_mutable_code;
  local_80[2] = (pCVar2->options_).generate_shared_code;
  local_80[3] = (pCVar2->options_).enforce_lite;
  pcVar3 = (pCVar2->options_).annotation_list_file._M_dataplus._M_p;
  local_78._M_p = (pointer)&local_68;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar3,
             pcVar3 + (pCVar2->options_).annotation_list_file._M_string_length);
  pcVar3 = (pCVar2->options_).output_list_file._M_dataplus._M_p;
  local_58._M_p = (pointer)&local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar3,
             pcVar3 + (pCVar2->options_).output_list_file._M_string_length);
  local_38._0_1_ = (pCVar2->options_).strip_nonfunctional_codegen;
  local_38._1_1_ = (pCVar2->options_).jvm_dsl;
  WriteFieldAccessorDocComment(printer,pFVar1,LIST_GETTER,(Options *)local_80,false,false,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_p != &local_48) {
    operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_p != &local_68) {
    operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
  }
  text_00._M_str =
       "@java.lang.Override\n$deprecation$public java.util.List<$type$> ${$get$capitalized_name$List$}$() {\n  return new com.google.protobuf.Internal.IntListAdapter<\n      $type$>($name$_, $name$_converter_);\n}\n"
  ;
  text_00._M_len = 0xca;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_00);
  begin_varname._M_str = "{";
  begin_varname._M_len = 1;
  end_varname._M_str = "}";
  end_varname._M_len = 1;
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,begin_varname,end_varname,this->descriptor_,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
  pFVar1 = this->descriptor_;
  pCVar2 = this->context_;
  local_d0[4] = (pCVar2->options_).opensource_runtime;
  local_d0[5] = (pCVar2->options_).annotate_code;
  local_d0[0] = (pCVar2->options_).generate_immutable_code;
  local_d0[1] = (pCVar2->options_).generate_mutable_code;
  local_d0[2] = (pCVar2->options_).generate_shared_code;
  local_d0[3] = (pCVar2->options_).enforce_lite;
  pcVar3 = (pCVar2->options_).annotation_list_file._M_dataplus._M_p;
  local_c8._M_p = (pointer)&local_b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,pcVar3,
             pcVar3 + (pCVar2->options_).annotation_list_file._M_string_length);
  pcVar3 = (pCVar2->options_).output_list_file._M_dataplus._M_p;
  local_a8._M_p = (pointer)&local_98;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar3,
             pcVar3 + (pCVar2->options_).output_list_file._M_string_length);
  local_88._0_1_ = (pCVar2->options_).strip_nonfunctional_codegen;
  local_88._1_1_ = (pCVar2->options_).jvm_dsl;
  WriteFieldAccessorDocComment(printer,pFVar1,LIST_COUNT,(Options *)local_d0,false,false,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_p != &local_98) {
    operator_delete(local_a8._M_p,local_98._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_p != &local_b8) {
    operator_delete(local_c8._M_p,local_b8._M_allocated_capacity + 1);
  }
  text_01._M_str =
       "@java.lang.Override\n$deprecation$public int ${$get$capitalized_name$Count$}$() {\n  return $name$_.size();\n}\n"
  ;
  text_01._M_len = 0x6c;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_01);
  begin_varname_00._M_str = "{";
  begin_varname_00._M_len = 1;
  end_varname_00._M_str = "}";
  end_varname_00._M_len = 1;
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,begin_varname_00,end_varname_00,this->descriptor_,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
  pFVar1 = this->descriptor_;
  pCVar2 = this->context_;
  local_120[4] = (pCVar2->options_).opensource_runtime;
  local_120[5] = (pCVar2->options_).annotate_code;
  local_120[0] = (pCVar2->options_).generate_immutable_code;
  local_120[1] = (pCVar2->options_).generate_mutable_code;
  local_120[2] = (pCVar2->options_).generate_shared_code;
  local_120[3] = (pCVar2->options_).enforce_lite;
  pcVar3 = (pCVar2->options_).annotation_list_file._M_dataplus._M_p;
  local_118._M_p = (pointer)&local_108;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_118,pcVar3,
             pcVar3 + (pCVar2->options_).annotation_list_file._M_string_length);
  pcVar3 = (pCVar2->options_).output_list_file._M_dataplus._M_p;
  local_f8._M_p = (pointer)&local_e8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f8,pcVar3,
             pcVar3 + (pCVar2->options_).output_list_file._M_string_length);
  local_d8._0_1_ = (pCVar2->options_).strip_nonfunctional_codegen;
  local_d8._1_1_ = (pCVar2->options_).jvm_dsl;
  WriteFieldAccessorDocComment
            (printer,pFVar1,LIST_INDEXED_GETTER,(Options *)local_120,false,false,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_p != &local_e8) {
    operator_delete(local_f8._M_p,local_e8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_p != &local_108) {
    operator_delete(local_118._M_p,local_108._M_allocated_capacity + 1);
  }
  text_02._M_str =
       "@java.lang.Override\n$deprecation$public $type$ ${$get$capitalized_name$$}$(int index) {\n  $type$ result = $type$.forNumber($name$_.getInt(index));\n  return result == null ? $unknown$ : result;\n}\n"
  ;
  text_02._M_len = 0xc3;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_02);
  begin_varname_01._M_str = "{";
  begin_varname_01._M_len = 1;
  end_varname_01._M_str = "}";
  end_varname_01._M_len = 1;
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,begin_varname_01,end_varname_01,this->descriptor_,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
  pFVar1 = this->descriptor_;
  pMVar5 = protobuf::internal::ExtensionSet::GetMessage
                     (&(pFVar1->merged_features_->field_0)._impl_._extensions_,pb::java,
                      (MessageLite *)PTR__JavaFeatures_default_instance__019e6258);
  if (*(char *)((long)&pMVar5[1]._internal_metadata_.ptr_ + 4) == '\0') {
    pEVar6 = FieldDescriptor::enum_type(pFVar1);
    if (pEVar6 != (EnumDescriptor *)0x0) {
      pEVar6 = FieldDescriptor::enum_type(pFVar1);
      bVar4 = EnumDescriptor::is_closed(pEVar6);
      if (!bVar4) {
        pFVar1 = this->descriptor_;
        pCVar2 = this->context_;
        local_170[4] = (pCVar2->options_).opensource_runtime;
        local_170[5] = (pCVar2->options_).annotate_code;
        local_170[0] = (pCVar2->options_).generate_immutable_code;
        local_170[1] = (pCVar2->options_).generate_mutable_code;
        local_170[2] = (pCVar2->options_).generate_shared_code;
        local_170[3] = (pCVar2->options_).enforce_lite;
        pcVar3 = (pCVar2->options_).annotation_list_file._M_dataplus._M_p;
        local_168._M_p = (pointer)&local_158;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_168,pcVar3,
                   pcVar3 + (pCVar2->options_).annotation_list_file._M_string_length);
        pcVar3 = (pCVar2->options_).output_list_file._M_dataplus._M_p;
        local_148._M_p = (pointer)&local_138;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_148,pcVar3,
                   pcVar3 + (pCVar2->options_).output_list_file._M_string_length);
        local_128._0_1_ = (pCVar2->options_).strip_nonfunctional_codegen;
        local_128._1_1_ = (pCVar2->options_).jvm_dsl;
        WriteFieldEnumValueAccessorDocComment
                  (printer,pFVar1,LIST_GETTER,(Options *)local_170,false,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_p != &local_138) {
          operator_delete(local_148._M_p,local_138._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_p != &local_158) {
          operator_delete(local_168._M_p,local_158._M_allocated_capacity + 1);
        }
        text_03._M_str =
             "@java.lang.Override\n$deprecation$public java.util.List<java.lang.Integer>\n${$get$capitalized_name$ValueList$}$() {\n  return $name$_;\n}\n"
        ;
        text_03._M_len = 0x87;
        io::Printer::
        Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                  (printer,vars,text_03);
        begin_varname_02._M_str = "{";
        begin_varname_02._M_len = 1;
        end_varname_02._M_str = "}";
        end_varname_02._M_len = 1;
        io::Printer::Annotate<google::protobuf::FieldDescriptor>
                  (printer,begin_varname_02,end_varname_02,this->descriptor_,
                   (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
        pFVar1 = this->descriptor_;
        pCVar2 = this->context_;
        local_1c0[4] = (pCVar2->options_).opensource_runtime;
        local_1c0[5] = (pCVar2->options_).annotate_code;
        local_1c0[0] = (pCVar2->options_).generate_immutable_code;
        local_1c0[1] = (pCVar2->options_).generate_mutable_code;
        local_1c0[2] = (pCVar2->options_).generate_shared_code;
        local_1c0[3] = (pCVar2->options_).enforce_lite;
        pcVar3 = (pCVar2->options_).annotation_list_file._M_dataplus._M_p;
        local_1b8._M_p = (pointer)&local_1a8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1b8,pcVar3,
                   pcVar3 + (pCVar2->options_).annotation_list_file._M_string_length);
        pcVar3 = (pCVar2->options_).output_list_file._M_dataplus._M_p;
        local_198._M_p = (pointer)&local_188;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_198,pcVar3,
                   pcVar3 + (pCVar2->options_).output_list_file._M_string_length);
        local_178._0_1_ = (pCVar2->options_).strip_nonfunctional_codegen;
        local_178._1_1_ = (pCVar2->options_).jvm_dsl;
        WriteFieldEnumValueAccessorDocComment
                  (printer,pFVar1,LIST_INDEXED_GETTER,(Options *)local_1c0,false,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_p != &local_188) {
          operator_delete(local_198._M_p,local_188._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_p != &local_1a8) {
          operator_delete(local_1b8._M_p,local_1a8._M_allocated_capacity + 1);
        }
        text_04._M_str =
             "@java.lang.Override\n$deprecation$public int ${$get$capitalized_name$Value$}$(int index) {\n  return $name$_.getInt(index);\n}\n"
        ;
        text_04._M_len = 0x7c;
        io::Printer::
        Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                  (printer,vars,text_04);
        begin_varname_03._M_str = "{";
        begin_varname_03._M_len = 1;
        end_varname_03._M_str = "}";
        end_varname_03._M_len = 1;
        io::Printer::Annotate<google::protobuf::FieldDescriptor>
                  (printer,begin_varname_03,end_varname_03,this->descriptor_,
                   (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
      }
    }
  }
  bVar4 = FieldDescriptor::is_packed(this->descriptor_);
  if (bVar4) {
    bVar4 = Context::HasGeneratedMethods(this->context_,this->descriptor_->containing_type_);
    if (bVar4) {
      text_05._M_str = "private int $name$MemoizedSerializedSize;\n";
      text_05._M_len = 0x2a;
      io::Printer::
      Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                (printer,vars,text_05);
    }
  }
  text_06._M_str =
       "private void ensure$capitalized_name$IsMutable() {\n  com.google.protobuf.Internal.IntList tmp = $name$_;\n  if (!tmp.isModifiable()) {\n    $name$_ =\n        com.google.protobuf.GeneratedMessageLite.mutableCopy(tmp);\n  }\n}\n"
  ;
  text_06._M_len = 0xdd;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_06);
  pFVar1 = this->descriptor_;
  pCVar2 = this->context_;
  local_210[4] = (pCVar2->options_).opensource_runtime;
  local_210[5] = (pCVar2->options_).annotate_code;
  local_210[0] = (pCVar2->options_).generate_immutable_code;
  local_210[1] = (pCVar2->options_).generate_mutable_code;
  local_210[2] = (pCVar2->options_).generate_shared_code;
  local_210[3] = (pCVar2->options_).enforce_lite;
  pcVar3 = (pCVar2->options_).annotation_list_file._M_dataplus._M_p;
  local_208._M_p = (pointer)&local_1f8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_208,pcVar3,
             pcVar3 + (pCVar2->options_).annotation_list_file._M_string_length);
  pcVar3 = (pCVar2->options_).output_list_file._M_dataplus._M_p;
  local_1e8._M_p = (pointer)&local_1d8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e8,pcVar3,
             pcVar3 + (pCVar2->options_).output_list_file._M_string_length);
  local_1c8._0_1_ = (pCVar2->options_).strip_nonfunctional_codegen;
  local_1c8._1_1_ = (pCVar2->options_).jvm_dsl;
  WriteFieldAccessorDocComment
            (printer,pFVar1,LIST_INDEXED_SETTER,(Options *)local_210,false,false,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_p != &local_1d8) {
    operator_delete(local_1e8._M_p,local_1d8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_p != &local_1f8) {
    operator_delete(local_208._M_p,local_1f8._M_allocated_capacity + 1);
  }
  text_07._M_str =
       "@java.lang.SuppressWarnings(\"ReturnValueIgnored\")\nprivate void set$capitalized_name$(\n    int index, $type$ value) {\n  value.getClass();  // minimal bytecode null check\n  ensure$capitalized_name$IsMutable();\n  $name$_.setInt(index, value.getNumber());\n}\n"
  ;
  text_07._M_len = 0xfe;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_07);
  pFVar1 = this->descriptor_;
  pCVar2 = this->context_;
  local_260[4] = (pCVar2->options_).opensource_runtime;
  local_260[5] = (pCVar2->options_).annotate_code;
  local_260[0] = (pCVar2->options_).generate_immutable_code;
  local_260[1] = (pCVar2->options_).generate_mutable_code;
  local_260[2] = (pCVar2->options_).generate_shared_code;
  local_260[3] = (pCVar2->options_).enforce_lite;
  pcVar3 = (pCVar2->options_).annotation_list_file._M_dataplus._M_p;
  local_258._M_p = (pointer)&local_248;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_258,pcVar3,
             pcVar3 + (pCVar2->options_).annotation_list_file._M_string_length);
  pcVar3 = (pCVar2->options_).output_list_file._M_dataplus._M_p;
  local_238._M_p = (pointer)&local_228;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_238,pcVar3,
             pcVar3 + (pCVar2->options_).output_list_file._M_string_length);
  local_218._0_1_ = (pCVar2->options_).strip_nonfunctional_codegen;
  local_218._1_1_ = (pCVar2->options_).jvm_dsl;
  WriteFieldAccessorDocComment(printer,pFVar1,LIST_ADDER,(Options *)local_260,false,false,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_p != &local_228) {
    operator_delete(local_238._M_p,local_228._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_p != &local_248) {
    operator_delete(local_258._M_p,local_248._M_allocated_capacity + 1);
  }
  text_08._M_str =
       "@java.lang.SuppressWarnings(\"ReturnValueIgnored\")\nprivate void add$capitalized_name$($type$ value) {\n  value.getClass();  // minimal bytecode null check\n  ensure$capitalized_name$IsMutable();\n  $name$_.addInt(value.getNumber());\n}\n"
  ;
  text_08._M_len = 0xe7;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_08);
  pFVar1 = this->descriptor_;
  pCVar2 = this->context_;
  local_2b0[4] = (pCVar2->options_).opensource_runtime;
  local_2b0[5] = (pCVar2->options_).annotate_code;
  local_2b0[0] = (pCVar2->options_).generate_immutable_code;
  local_2b0[1] = (pCVar2->options_).generate_mutable_code;
  local_2b0[2] = (pCVar2->options_).generate_shared_code;
  local_2b0[3] = (pCVar2->options_).enforce_lite;
  pcVar3 = (pCVar2->options_).annotation_list_file._M_dataplus._M_p;
  local_2a8._M_p = (pointer)&local_298;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2a8,pcVar3,
             pcVar3 + (pCVar2->options_).annotation_list_file._M_string_length);
  pcVar3 = (pCVar2->options_).output_list_file._M_dataplus._M_p;
  local_288._M_p = (pointer)&local_278;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_288,pcVar3,
             pcVar3 + (pCVar2->options_).output_list_file._M_string_length);
  local_268._0_1_ = (pCVar2->options_).strip_nonfunctional_codegen;
  local_268._1_1_ = (pCVar2->options_).jvm_dsl;
  WriteFieldAccessorDocComment
            (printer,pFVar1,LIST_MULTI_ADDER,(Options *)local_2b0,false,false,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_p != &local_278) {
    operator_delete(local_288._M_p,local_278._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_p != &local_298) {
    operator_delete(local_2a8._M_p,local_298._M_allocated_capacity + 1);
  }
  text_09._M_str =
       "private void addAll$capitalized_name$(\n    java.lang.Iterable<? extends $type$> values) {\n  ensure$capitalized_name$IsMutable();\n  for ($type$ value : values) {\n    $name$_.addInt(value.getNumber());\n  }\n}\n"
  ;
  text_09._M_len = 0xce;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_09);
  pFVar1 = this->descriptor_;
  pCVar2 = this->context_;
  local_300[4] = (pCVar2->options_).opensource_runtime;
  local_300[5] = (pCVar2->options_).annotate_code;
  local_300[0] = (pCVar2->options_).generate_immutable_code;
  local_300[1] = (pCVar2->options_).generate_mutable_code;
  local_300[2] = (pCVar2->options_).generate_shared_code;
  local_300[3] = (pCVar2->options_).enforce_lite;
  pcVar3 = (pCVar2->options_).annotation_list_file._M_dataplus._M_p;
  local_2f8._M_p = (pointer)&local_2e8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2f8,pcVar3,
             pcVar3 + (pCVar2->options_).annotation_list_file._M_string_length);
  pcVar3 = (pCVar2->options_).output_list_file._M_dataplus._M_p;
  local_2d8._M_p = (pointer)&local_2c8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2d8,pcVar3,
             pcVar3 + (pCVar2->options_).output_list_file._M_string_length);
  local_2b8._0_1_ = (pCVar2->options_).strip_nonfunctional_codegen;
  local_2b8._1_1_ = (pCVar2->options_).jvm_dsl;
  WriteFieldAccessorDocComment(printer,pFVar1,CLEARER,(Options *)local_300,false,false,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_p != &local_2c8) {
    operator_delete(local_2d8._M_p,local_2c8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_p != &local_2e8) {
    operator_delete(local_2f8._M_p,local_2e8._M_allocated_capacity + 1);
  }
  text_10._M_str = "private void clear$capitalized_name$() {\n  $name$_ = emptyIntList();\n}\n";
  text_10._M_len = 0x47;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_10);
  pFVar1 = this->descriptor_;
  pMVar5 = protobuf::internal::ExtensionSet::GetMessage
                     (&(pFVar1->merged_features_->field_0)._impl_._extensions_,pb::java,
                      (MessageLite *)PTR__JavaFeatures_default_instance__019e6258);
  if (*(char *)((long)&pMVar5[1]._internal_metadata_.ptr_ + 4) == '\0') {
    pEVar6 = FieldDescriptor::enum_type(pFVar1);
    if (pEVar6 != (EnumDescriptor *)0x0) {
      pEVar6 = FieldDescriptor::enum_type(pFVar1);
      bVar4 = EnumDescriptor::is_closed(pEVar6);
      if (!bVar4) {
        pFVar1 = this->descriptor_;
        pCVar2 = this->context_;
        local_350[4] = (pCVar2->options_).opensource_runtime;
        local_350[5] = (pCVar2->options_).annotate_code;
        local_350[0] = (pCVar2->options_).generate_immutable_code;
        local_350[1] = (pCVar2->options_).generate_mutable_code;
        local_350[2] = (pCVar2->options_).generate_shared_code;
        local_350[3] = (pCVar2->options_).enforce_lite;
        pcVar3 = (pCVar2->options_).annotation_list_file._M_dataplus._M_p;
        local_348._M_p = (pointer)&local_338;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_348,pcVar3,
                   pcVar3 + (pCVar2->options_).annotation_list_file._M_string_length);
        pcVar3 = (pCVar2->options_).output_list_file._M_dataplus._M_p;
        local_328._M_p = (pointer)&local_318;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_328,pcVar3,
                   pcVar3 + (pCVar2->options_).output_list_file._M_string_length);
        local_308._0_1_ = (pCVar2->options_).strip_nonfunctional_codegen;
        local_308._1_1_ = (pCVar2->options_).jvm_dsl;
        WriteFieldEnumValueAccessorDocComment
                  (printer,pFVar1,SETTER,(Options *)local_350,false,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_p != &local_318) {
          operator_delete(local_328._M_p,local_318._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_348._M_p != &local_338) {
          operator_delete(local_348._M_p,local_338._M_allocated_capacity + 1);
        }
        text_11._M_str =
             "private void set$capitalized_name$Value(\n    int index, int value) {\n  ensure$capitalized_name$IsMutable();\n  $name$_.setInt(index, value);\n}\n"
        ;
        text_11._M_len = 0x8e;
        io::Printer::
        Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                  (printer,vars,text_11);
        pFVar1 = this->descriptor_;
        pCVar2 = this->context_;
        local_3a0[4] = (pCVar2->options_).opensource_runtime;
        local_3a0[5] = (pCVar2->options_).annotate_code;
        local_3a0[0] = (pCVar2->options_).generate_immutable_code;
        local_3a0[1] = (pCVar2->options_).generate_mutable_code;
        local_3a0[2] = (pCVar2->options_).generate_shared_code;
        local_3a0[3] = (pCVar2->options_).enforce_lite;
        pcVar3 = (pCVar2->options_).annotation_list_file._M_dataplus._M_p;
        local_398._M_p = (pointer)&local_388;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_398,pcVar3,
                   pcVar3 + (pCVar2->options_).annotation_list_file._M_string_length);
        pcVar3 = (pCVar2->options_).output_list_file._M_dataplus._M_p;
        local_378._M_p = (pointer)&local_368;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_378,pcVar3,
                   pcVar3 + (pCVar2->options_).output_list_file._M_string_length);
        local_358._0_1_ = (pCVar2->options_).strip_nonfunctional_codegen;
        local_358._1_1_ = (pCVar2->options_).jvm_dsl;
        WriteFieldEnumValueAccessorDocComment
                  (printer,pFVar1,LIST_ADDER,(Options *)local_3a0,false,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_378._M_p != &local_368) {
          operator_delete(local_378._M_p,local_368._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_398._M_p != &local_388) {
          operator_delete(local_398._M_p,local_388._M_allocated_capacity + 1);
        }
        text_12._M_str =
             "private void add$capitalized_name$Value(int value) {\n  ensure$capitalized_name$IsMutable();\n  $name$_.addInt(value);\n}\n"
        ;
        text_12._M_len = 0x77;
        io::Printer::
        Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                  (printer,vars,text_12);
        pFVar1 = this->descriptor_;
        pCVar2 = this->context_;
        local_3f0[4] = (pCVar2->options_).opensource_runtime;
        local_3f0[5] = (pCVar2->options_).annotate_code;
        local_3f0[0] = (pCVar2->options_).generate_immutable_code;
        local_3f0[1] = (pCVar2->options_).generate_mutable_code;
        local_3f0[2] = (pCVar2->options_).generate_shared_code;
        local_3f0[3] = (pCVar2->options_).enforce_lite;
        pcVar3 = (pCVar2->options_).annotation_list_file._M_dataplus._M_p;
        local_3e8._M_p = (pointer)&local_3d8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3e8,pcVar3,
                   pcVar3 + (pCVar2->options_).annotation_list_file._M_string_length);
        pcVar3 = (pCVar2->options_).output_list_file._M_dataplus._M_p;
        local_3c8._M_p = (pointer)&local_3b8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3c8,pcVar3,
                   pcVar3 + (pCVar2->options_).output_list_file._M_string_length);
        local_3a8._0_1_ = (pCVar2->options_).strip_nonfunctional_codegen;
        local_3a8._1_1_ = (pCVar2->options_).jvm_dsl;
        WriteFieldEnumValueAccessorDocComment
                  (printer,pFVar1,LIST_MULTI_ADDER,(Options *)local_3f0,false,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c8._M_p != &local_3b8) {
          operator_delete(local_3c8._M_p,local_3b8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3e8._M_p != &local_3d8) {
          operator_delete(local_3e8._M_p,local_3d8._M_allocated_capacity + 1);
        }
        text_13._M_str =
             "private void addAll$capitalized_name$Value(\n    java.lang.Iterable<java.lang.Integer> values) {\n  ensure$capitalized_name$IsMutable();\n  for (int value : values) {\n    $name$_.addInt(value);\n  }\n}\n"
        ;
        text_13._M_len = 0xc5;
        io::Printer::
        Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                  (printer,vars,text_13);
      }
    }
  }
  return;
}

Assistant:

void RepeatedImmutableEnumFieldLiteGenerator::GenerateMembers(
    io::Printer* printer) const {
  printer->Print(
      variables_,
      "private com.google.protobuf.Internal.IntList $name$_;\n"
      "private static final "
      "com.google.protobuf.Internal.IntListAdapter.IntConverter<\n"
      "    $type$> $name$_converter_ =\n"
      "        new com.google.protobuf.Internal.IntListAdapter.IntConverter<\n"
      "            $type$>() {\n"
      "          @java.lang.Override\n"
      "          public $type$ convert(int from) {\n"
      "            $type$ result = $type$.forNumber(from);\n"
      "            return result == null ? $unknown$ : result;\n"
      "          }\n"
      "        };\n");
  PrintExtraFieldInfo(variables_, printer);
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_GETTER,
                               context_->options());
  printer->Print(variables_,
                 "@java.lang.Override\n"
                 "$deprecation$public java.util.List<$type$> "
                 "${$get$capitalized_name$List$}$() {\n"
                 "  return new com.google.protobuf.Internal.IntListAdapter<\n"
                 "      $type$>($name$_, $name$_converter_);\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_COUNT,
                               context_->options());
  printer->Print(
      variables_,
      "@java.lang.Override\n"
      "$deprecation$public int ${$get$capitalized_name$Count$}$() {\n"
      "  return $name$_.size();\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_INDEXED_GETTER,
                               context_->options());
  printer->Print(
      variables_,
      // NB: Do not use the "$name$_converter_" field; the usage of generics
      // (and requisite upcasts to Object) prevent optimizations.  Even
      // without any optimizations, the below code is cheaper because it
      // avoids boxing an int and a checkcast from the generics.
      "@java.lang.Override\n"
      "$deprecation$public $type$ ${$get$capitalized_name$$}$(int index) {\n"
      "  $type$ result = $type$.forNumber($name$_.getInt(index));\n"
      "  return result == null ? $unknown$ : result;\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);
  if (SupportUnknownEnumValue(descriptor_)) {
    WriteFieldEnumValueAccessorDocComment(printer, descriptor_, LIST_GETTER,
                                          context_->options());
    printer->Print(variables_,
                   "@java.lang.Override\n"
                   "$deprecation$public java.util.List<java.lang.Integer>\n"
                   "${$get$capitalized_name$ValueList$}$() {\n"
                   "  return $name$_;\n"
                   "}\n");
    printer->Annotate("{", "}", descriptor_);
    WriteFieldEnumValueAccessorDocComment(
        printer, descriptor_, LIST_INDEXED_GETTER, context_->options());
    printer->Print(variables_,
                   "@java.lang.Override\n"
                   "$deprecation$public int "
                   "${$get$capitalized_name$Value$}$(int index) {\n"
                   "  return $name$_.getInt(index);\n"
                   "}\n");
    printer->Annotate("{", "}", descriptor_);
  }

  if (!EnableExperimentalRuntimeForLite() && descriptor_->is_packed() &&
      context_->HasGeneratedMethods(descriptor_->containing_type())) {
    printer->Print(variables_, "private int $name$MemoizedSerializedSize;\n");
  }

  // Generate private setters for the builder to proxy into.
  printer->Print(
      variables_,
      "private void ensure$capitalized_name$IsMutable() {\n"
      // Use a temporary to avoid a redundant iget-object.
      "  com.google.protobuf.Internal.IntList tmp = $name$_;\n"
      "  if (!tmp.isModifiable()) {\n"
      "    $name$_ =\n"
      "        com.google.protobuf.GeneratedMessageLite.mutableCopy(tmp);\n"
      "  }\n"
      "}\n");
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_INDEXED_SETTER,
                               context_->options(), /* builder */ false,
                               /* kdoc */ false, /* is_private */ true);
  printer->Print(variables_,
                 "@java.lang.SuppressWarnings(\"ReturnValueIgnored\")\n"
                 "private void set$capitalized_name$(\n"
                 "    int index, $type$ value) {\n"
                 "  value.getClass();  // minimal bytecode null check\n"
                 "  ensure$capitalized_name$IsMutable();\n"
                 "  $name$_.setInt(index, value.getNumber());\n"
                 "}\n");
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_ADDER,
                               context_->options(), /* builder */ false,
                               /* kdoc */ false, /* is_private */ true);
  printer->Print(variables_,
                 "@java.lang.SuppressWarnings(\"ReturnValueIgnored\")\n"
                 "private void add$capitalized_name$($type$ value) {\n"
                 "  value.getClass();  // minimal bytecode null check\n"
                 "  ensure$capitalized_name$IsMutable();\n"
                 "  $name$_.addInt(value.getNumber());\n"
                 "}\n");
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_MULTI_ADDER,
                               context_->options(), /* builder */ false,
                               /* kdoc */ false, /* is_private */ true);
  printer->Print(variables_,
                 "private void addAll$capitalized_name$(\n"
                 "    java.lang.Iterable<? extends $type$> values) {\n"
                 "  ensure$capitalized_name$IsMutable();\n"
                 "  for ($type$ value : values) {\n"
                 "    $name$_.addInt(value.getNumber());\n"
                 "  }\n"
                 "}\n");
  WriteFieldAccessorDocComment(printer, descriptor_, CLEARER,
                               context_->options(), /* builder */ false,
                               /* kdoc */ false, /* is_private */ true);
  printer->Print(variables_,
                 "private void clear$capitalized_name$() {\n"
                 "  $name$_ = emptyIntList();\n"
                 "}\n");

  if (SupportUnknownEnumValue(descriptor_)) {
    WriteFieldEnumValueAccessorDocComment(printer, descriptor_, SETTER,
                                          context_->options());
    printer->Print(variables_,
                   "private void set$capitalized_name$Value(\n"
                   "    int index, int value) {\n"
                   "  ensure$capitalized_name$IsMutable();\n"
                   "  $name$_.setInt(index, value);\n"
                   "}\n");
    WriteFieldEnumValueAccessorDocComment(printer, descriptor_, LIST_ADDER,
                                          context_->options());
    printer->Print(variables_,
                   "private void add$capitalized_name$Value(int value) {\n"
                   "  ensure$capitalized_name$IsMutable();\n"
                   "  $name$_.addInt(value);\n"
                   "}\n");
    WriteFieldEnumValueAccessorDocComment(
        printer, descriptor_, LIST_MULTI_ADDER, context_->options());
    printer->Print(variables_,
                   "private void addAll$capitalized_name$Value(\n"
                   "    java.lang.Iterable<java.lang.Integer> values) {\n"
                   "  ensure$capitalized_name$IsMutable();\n"
                   "  for (int value : values) {\n"
                   "    $name$_.addInt(value);\n"
                   "  }\n"
                   "}\n");
  }
}